

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_array_walk(jx9_value *pArray,_func_int_jx9_value_ptr_jx9_value_ptr_void_ptr *xWalk,
                  void *pUserData)

{
  sxi32 sVar1;
  int rc;
  void *pUserData_local;
  _func_int_jx9_value_ptr_jx9_value_ptr_void_ptr *xWalk_local;
  jx9_value *pArray_local;
  
  if (xWalk == (_func_int_jx9_value_ptr_jx9_value_ptr_void_ptr *)0x0) {
    pArray_local._4_4_ = -0x18;
  }
  else if ((pArray->iFlags & 0x40U) == 0) {
    pArray_local._4_4_ = -0x18;
  }
  else {
    sVar1 = jx9HashmapWalk((jx9_hashmap *)(pArray->x).pOther,xWalk,pUserData);
    pArray_local._4_4_ = 0;
    if (sVar1 != 0) {
      pArray_local._4_4_ = -10;
    }
  }
  return pArray_local._4_4_;
}

Assistant:

JX9_PRIVATE int jx9_array_walk(jx9_value *pArray, int (*xWalk)(jx9_value *pValue, jx9_value *, void *), void *pUserData)
{
	int rc;
	if( xWalk == 0 ){
		return JX9_CORRUPT;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( (pArray->iFlags & MEMOBJ_HASHMAP) == 0 ){
		return JX9_CORRUPT;
	}
	/* Start the walk process */
	rc = jx9HashmapWalk((jx9_hashmap *)pArray->x.pOther, xWalk, pUserData);
	return rc != JX9_OK ? JX9_ABORT /* User callback request an operation abort*/ : JX9_OK;
}